

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O0

void ecs_bulk_add_remove_type
               (ecs_world_t *world,ecs_type_t to_add,ecs_type_t to_remove,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  ecs_table_t *src_table;
  int32_t dense_index;
  ecs_type_t peVar2;
  _Bool _Var3;
  ecs_stage_t *peVar4;
  ecs_entity_t *peVar5;
  ecs_table_t *peVar6;
  int iVar7;
  bool bVar8;
  ecs_entities_t eVar9;
  ecs_entity_t eStack_90;
  ecs_table_t *local_88;
  ecs_table_t *dst_table;
  ecs_table_t *table;
  int32_t count;
  int32_t i;
  ecs_entities_t removed;
  ecs_entities_t added;
  ecs_entities_t to_remove_array;
  ecs_entities_t to_add_array;
  ecs_stage_t *stage;
  ecs_filter_t *filter_local;
  ecs_type_t to_remove_local;
  ecs_type_t to_add_local;
  ecs_world_t *world_local;
  
  eStack_90 = 0x1472eb;
  to_add_local = (ecs_type_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x6a);
  if (to_add_local == (ecs_type_t)0x0) {
    eStack_90 = 0x147313;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x6a,
                  "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  eStack_90 = 0x14731c;
  peVar4 = ecs_get_stage((ecs_world_t **)&to_add_local);
  eStack_90 = 0x14735d;
  _ecs_assert(peVar4 == (ecs_stage_t *)&to_add_local[0x5b0].elem_size,0x23,(char *)0x0,
              "stage == &world->stage",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x6c);
  if (peVar4 != (ecs_stage_t *)&to_add_local[0x5b0].elem_size) {
    eStack_90 = 0x147392;
    __assert_fail("stage == &world->stage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x6c,
                  "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  eStack_90 = 0x14739b;
  eVar9 = ecs_type_to_entities(to_add);
  to_remove_array._8_8_ = eVar9.array;
  iVar7 = eVar9.count;
  eStack_90 = 0x1473ab;
  eVar9 = ecs_type_to_entities(to_remove);
  added._8_8_ = eVar9.array;
  to_remove_array.array._0_4_ = eVar9.count;
  removed._8_8_ = (long)&local_88 - ((long)(iVar7 << 3) + 0xfU & 0xfffffffffffffff0);
  added.array._0_4_ = 0;
  peVar5 = (ecs_entity_t *)
           (removed._8_8_ - ((long)((int)to_remove_array.array << 3) + 0xfU & 0xfffffffffffffff0));
  removed.array._0_4_ = 0;
  peVar1 = *(ecs_sparse_t **)(to_add_local + 0x483);
  _count = peVar5;
  peVar5[-1] = 0x14740c;
  table._0_4_ = ecs_sparse_count(peVar1);
  table._4_4_ = 0;
  do {
    dense_index = table._4_4_;
    if ((int32_t)table <= table._4_4_) {
      return;
    }
    peVar1 = *(ecs_sparse_t **)(to_add_local + 0x483);
    peVar5[-1] = 0x14743a;
    peVar6 = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
    peVar2 = to_add_local;
    dst_table = peVar6;
    if ((peVar6->flags & 1) == 0) {
      peVar5[-1] = 0x147463;
      _Var3 = ecs_table_match_filter((ecs_world_t *)peVar2,peVar6,filter);
      peVar2 = to_add_local;
      peVar6 = dst_table;
      if (_Var3) {
        peVar5[-1] = 0x147481;
        peVar6 = ecs_table_traverse_remove
                           ((ecs_world_t *)peVar2,peVar6,(ecs_entities_t *)&added.count,
                            (ecs_entities_t *)&count);
        peVar2 = to_add_local;
        local_88 = peVar6;
        peVar5[-1] = 0x14749a;
        local_88 = ecs_table_traverse_add
                             ((ecs_world_t *)peVar2,peVar6,(ecs_entities_t *)&to_remove_array.count,
                              (ecs_entities_t *)&removed.count);
        bVar8 = (int)removed.array <= (int)to_remove_array.array;
        peVar5[-1] = 0x1474cf;
        _ecs_assert(bVar8,0xc,(char *)0x0,"removed.count <= to_remove_array.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x8e);
        if ((int)to_remove_array.array < (int)removed.array) {
          peVar5[-1] = 0x1474f8;
          __assert_fail("removed.count <= to_remove_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x8e,
                        "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                       );
        }
        bVar8 = (int)added.array <= iVar7;
        peVar5[-1] = 0x147529;
        _ecs_assert(bVar8,0xc,(char *)0x0,"added.count <= to_add_array.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x8f);
        if (iVar7 < (int)added.array) {
          peVar5[-1] = 0x147552;
          __assert_fail("added.count <= to_add_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x8f,
                        "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                       );
        }
        if ((dst_table != local_88) && (((int)added.array != 0 || ((int)removed.array != 0)))) {
          bVar8 = local_88 != (ecs_table_t *)0x0;
          peVar5[-1] = 0x14759a;
          _ecs_assert(bVar8,0xc,(char *)0x0,"dst_table != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x95);
          peVar2 = to_add_local;
          src_table = dst_table;
          peVar6 = local_88;
          if (local_88 == (ecs_table_t *)0x0) {
            peVar5[-1] = 0x1475c2;
            __assert_fail("dst_table != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x95,
                          "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                         );
          }
          peVar5[-1] = 0x1475db;
          merge_table((ecs_world_t *)peVar2,peVar6,src_table,(ecs_entities_t *)&removed.count,
                      (ecs_entities_t *)&count);
          added.array._0_4_ = 0;
          removed.array._0_4_ = 0;
        }
      }
    }
    table._4_4_ = table._4_4_ + 1;
  } while( true );
}

Assistant:

void ecs_bulk_add_remove_type(
    ecs_world_t *world,
    ecs_type_t to_add,
    ecs_type_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = ecs_type_to_entities(to_add);
    ecs_entities_t to_remove_array = ecs_type_to_entities(to_remove);

    ecs_entities_t added = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_add_array.count),
        .count = 0
    }; 

    ecs_entities_t removed = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_remove_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }

        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);
        
        dst_table = ecs_table_traverse_add(
            world, dst_table, &to_add_array, &added);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);

        if (table == dst_table || (!added.count && !removed.count)) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   

        merge_table(world, dst_table, table, &added, &removed);
        added.count = 0;
        removed.count = 0;
    }    
}